

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O2

void __thiscall CaDiCaL::External::push_witness_literal_on_extension_stack(External *this,int ilit)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int elit;
  int local_1c;
  
  uVar3 = (ulong)(uint)-ilit;
  if (0 < ilit) {
    uVar3 = (ulong)(uint)ilit;
  }
  iVar1 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  local_1c = -iVar1;
  if (-1 < ilit) {
    local_1c = iVar1;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->extension,&local_1c);
  bVar2 = marked(this,&this->witness,local_1c);
  if (!bVar2) {
    mark(this,&this->witness,local_1c);
  }
  return;
}

Assistant:

void External::push_witness_literal_on_extension_stack (int ilit) {
  assert (ilit);
  const int elit = internal->externalize (ilit);
  assert (elit);
  extension.push_back (elit);
  LOG ("pushing witness literal %d on extension stack (internal %d)", elit,
       ilit);
  if (marked (witness, elit))
    return;
  LOG ("marking witness %d", elit);
  mark (witness, elit);
}